

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_13fc48::swap8(unsigned_long_long *val)

{
  unsigned_long_long uVar1;
  uchar *src;
  uchar *dst;
  unsigned_long_long tmp;
  unsigned_long_long *val_local;
  
  uVar1 = *val;
  dst._7_1_ = (undefined1)(uVar1 >> 0x38);
  *(undefined1 *)val = dst._7_1_;
  dst._6_1_ = (undefined1)(uVar1 >> 0x30);
  *(undefined1 *)((long)val + 1) = dst._6_1_;
  dst._5_1_ = (undefined1)(uVar1 >> 0x28);
  *(undefined1 *)((long)val + 2) = dst._5_1_;
  dst._4_1_ = (undefined1)(uVar1 >> 0x20);
  *(undefined1 *)((long)val + 3) = dst._4_1_;
  dst._3_1_ = (undefined1)(uVar1 >> 0x18);
  *(undefined1 *)((long)val + 4) = dst._3_1_;
  dst._2_1_ = (undefined1)(uVar1 >> 0x10);
  *(undefined1 *)((long)val + 5) = dst._2_1_;
  dst._1_1_ = (undefined1)(uVar1 >> 8);
  *(undefined1 *)((long)val + 6) = dst._1_1_;
  dst._0_1_ = (undefined1)uVar1;
  *(undefined1 *)((long)val + 7) = dst._0_1_;
  return;
}

Assistant:

void swap8(unsigned long long *val) {
  unsigned long long tmp = (*val);
  unsigned char *dst = (unsigned char *)val;
  unsigned char *src = (unsigned char *)&tmp;

  dst[0] = src[7];
  dst[1] = src[6];
  dst[2] = src[5];
  dst[3] = src[4];
  dst[4] = src[3];
  dst[5] = src[2];
  dst[6] = src[1];
  dst[7] = src[0];
}